

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O3

Aig_Man_t * Aig_ManDupSimpleDfsPart(Aig_Man_t *p,Vec_Ptr_t *vPis,Vec_Ptr_t *vPos)

{
  void *pvVar1;
  int iVar2;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar3;
  long lVar4;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  if (0 < vPis->nSize) {
    lVar4 = 0;
    do {
      pvVar1 = vPis->pArray[lVar4];
      pAVar3 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vPis->nSize);
  }
  if (0 < vPos->nSize) {
    lVar4 = 0;
    do {
      pvVar1 = vPos->pArray[lVar4];
      pAVar3 = Aig_ManDupSimpleDfs_rec
                         (p_00,p,(Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe));
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                           ((ulong)((uint)*(undefined8 *)((long)pvVar1 + 8) & 1) ^ (ulong)pAVar3));
      lVar4 = lVar4 + 1;
    } while (lVar4 < vPos->nSize);
  }
  Aig_ManSetRegNum(p_00,0);
  iVar2 = Aig_ManCheck(p_00);
  if (iVar2 == 0) {
    puts("Aig_ManDupSimple(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupSimpleDfsPart( Aig_Man_t * p, Vec_Ptr_t * vPis, Vec_Ptr_t * vPos )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1( pNew );
    Vec_PtrForEachEntry( Aig_Obj_t *, vPis, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // duplicate internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vPos, pObj, i )
    {
        pObjNew = Aig_ManDupSimpleDfs_rec( pNew, p, Aig_ObjFanin0(pObj) );        
        pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObj) );
        Aig_ObjCreateCo( pNew, pObjNew );
    }
    Aig_ManSetRegNum( pNew, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}